

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.h
# Opt level: O2

bool mocker::detail::runOptPassImpl<mocker::CodegenPreparation>(Module *module,FuncPass *param_2)

{
  bool bVar1;
  bool bVar2;
  __node_base *p_Var3;
  CodegenPreparation local_110;
  
  p_Var3 = &(module->funcs)._M_h._M_before_begin;
  bVar2 = false;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    if (*(char *)&p_Var3[0x11]._M_nxt == '\0') {
      CodegenPreparation::CodegenPreparation(&local_110,(FunctionModule *)(p_Var3 + 5));
      bVar1 = CodegenPreparation::operator()(&local_110);
      bVar2 = (bool)(bVar2 | bVar1);
      CodegenPreparation::~CodegenPreparation(&local_110);
    }
  }
  return bVar2;
}

Assistant:

bool runOptPassImpl(ir::Module &module, FuncPass *, Args &&... args) {
  auto res = false;
  for (auto &func : module.getFuncs()) {
    if (func.second.isExternalFunc())
      continue;
    res |= Pass{func.second, std::forward<Args>(args)...}();
  }
  return res;
}